

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles31::Functional::anon_unknown_2::SamplePosDistributionCase::verifySampleBuffers
          (SamplePosDistributionCase *this,
          vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_reference pvVar5;
  TestLog *pTVar6;
  size_type sVar7;
  MessageBuilder *pMVar8;
  reference pvVar9;
  reference v;
  int *piVar10;
  uint *puVar11;
  QualityWarning *this_00;
  size_t siglen;
  uchar *tbs;
  size_t in_R9;
  bool local_19c1;
  bool local_19b9;
  MessageBuilder local_18e0;
  undefined1 local_175a;
  allocator<char> local_1759;
  string local_1758;
  ConstPixelBufferAccess local_1738;
  allocator<char> local_1709;
  string local_1708;
  allocator<char> local_16e1;
  string local_16e0;
  LogImage local_16c0;
  allocator<char> local_1629;
  string local_1628;
  allocator<char> local_1601;
  string local_1600;
  LogImageSet local_15e0;
  MessageBuilder local_15a0;
  int local_141c;
  MessageBuilder local_1418;
  deUint32 local_1294;
  MessageBuilder local_1290;
  Vector<int,_2> local_1110;
  RGBA local_1108;
  RGBA local_1104;
  int local_1100;
  RGBA color_1;
  int sampleNdx_3;
  IVec3 colorSum;
  int x_1;
  int y_1;
  Vector<float,_4> local_f68;
  PixelBufferAccess local_f58;
  undefined4 local_f30;
  int local_f2c;
  int printFloodLimit_1;
  int printCount_1;
  Surface errorMask_1;
  SampleAverageVerifier verifier;
  allocator<char> local_ec9;
  string local_ec8;
  allocator<char> local_ea1;
  string local_ea0;
  LogImage local_e80;
  allocator<char> local_de9;
  string local_de8;
  allocator<char> local_dc1;
  string local_dc0;
  LogImageSet local_da0;
  MessageBuilder local_d60;
  int local_bdc;
  MessageBuilder local_bd8;
  deUint32 local_a54;
  MessageBuilder local_a50;
  int local_8cc;
  int local_8c8;
  int sampleNdxB;
  int sampleNdxA;
  RGBA local_8bc;
  int local_8b8;
  RGBA color;
  int sampleNdx_2;
  int iStack_8ac;
  bool samplePosNotUnique;
  int x;
  int y;
  Vector<float,_4> local_728;
  PixelBufferAccess local_718;
  undefined4 local_6ec;
  int local_6e8;
  int printFloodLimit;
  int printCount;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> samplePositions;
  Surface errorMask;
  undefined1 local_6a8 [7];
  bool uniquenessOk;
  Verifier local_528;
  int local_520;
  int local_51c;
  MessageBuilder local_518;
  int local_394;
  undefined1 local_390 [4];
  int sampleNdx_1;
  byte local_209;
  undefined1 local_208 [7];
  bool rangeOk;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  LogImage local_160;
  int local_d0;
  allocator<char> local_c9;
  int sampleNdx;
  allocator<char> local_91;
  string local_90;
  LogImageSet local_70;
  byte local_2a;
  byte local_29;
  int local_28;
  bool distibutionError;
  int iStack_24;
  bool allOk;
  int height;
  int width;
  vector<tcu::Surface,_std::allocator<tcu::Surface>_> *resultBuffers_local;
  SamplePosDistributionCase *this_local;
  
  _height = resultBuffers;
  resultBuffers_local = (vector<tcu::Surface,_std::allocator<tcu::Surface>_> *)this;
  pvVar5 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[](resultBuffers,0);
  iStack_24 = tcu::Surface::getWidth(pvVar5);
  pvVar5 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[](_height,0);
  local_28 = tcu::Surface::getHeight(pvVar5);
  local_29 = 1;
  local_2a = 0;
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"SampleBuffers",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sampleNdx,"Image sample buffers",&local_c9);
  tcu::LogImageSet::LogImageSet(&local_70,&local_90,(string *)&sampleNdx);
  tcu::TestLog::operator<<(pTVar6,&local_70);
  tcu::LogImageSet::~LogImageSet(&local_70);
  std::__cxx11::string::~string((string *)&sampleNdx);
  std::allocator<char>::~allocator(&local_c9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  for (local_d0 = 0; iVar3 = local_d0,
      sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height),
      iVar3 < (int)sVar7; local_d0 = local_d0 + 1) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    de::toString<int>(&local_1a0,&local_d0);
    std::operator+(&local_180,"Buffer",&local_1a0);
    de::toString<int>(&local_1e0,&local_d0);
    std::operator+(&local_1c0,"Sample ",&local_1e0);
    pvVar5 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                       (_height,(long)local_d0);
    tcu::Surface::getAccess((ConstPixelBufferAccess *)local_208,pvVar5);
    tcu::LogImage::LogImage
              (&local_160,&local_180,&local_1c0,(ConstPixelBufferAccess *)local_208,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar6,&local_160);
    tcu::LogImage::~LogImage(&local_160);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
  }
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  local_209 = 1;
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)local_390,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_390,(char (*) [32])"Verifying sample position range");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_390);
  for (local_394 = 0; iVar3 = local_394,
      sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height),
      iVar3 < (int)sVar7; local_394 = local_394 + 1) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_518,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_518,(char (*) [18])"Verifying sample ");
    local_51c = local_394 + 1;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_51c);
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [2])0x2bb3658);
    sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
    local_520 = (int)sVar7;
    pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_520);
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_518);
    pvVar5 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                       (_height,(long)local_394);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    NoRedVerifier::NoRedVerifier((NoRedVerifier *)&local_528);
    bVar1 = verifyImageWithVerifier(pvVar5,pTVar6,&local_528,false);
    local_209 = (local_209 & 1 & bVar1) != 0;
  }
  if ((local_209 & 1) == 0) {
    local_29 = 0;
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)local_6a8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_6a8,
                        (char (*) [37])"Sample position verification failed.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_6a8);
  }
  bVar1 = true;
  tcu::Surface::Surface
            ((Surface *)
             &samplePositions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,iStack_24,local_28);
  sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
  std::allocator<tcu::Vector<float,_2>_>::allocator
            ((allocator<tcu::Vector<float,_2>_> *)((long)&printFloodLimit + 3));
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&printCount,
             sVar7,(allocator<tcu::Vector<float,_2>_> *)((long)&printFloodLimit + 3));
  std::allocator<tcu::Vector<float,_2>_>::~allocator
            ((allocator<tcu::Vector<float,_2>_> *)((long)&printFloodLimit + 3));
  local_6e8 = 0;
  local_6ec = 5;
  tcu::Surface::getAccess
            (&local_718,
             (Surface *)
             &samplePositions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  tcu::Vector<float,_4>::Vector(&local_728,0.0,1.0,0.0,1.0);
  tcu::clear(&local_718,&local_728);
  pTVar6 = tcu::TestContext::getLog
                     ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase
                      .super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<((MessageBuilder *)&x,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&x,(char (*) [38])"Verifying sample position uniqueness.");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x);
  for (iStack_8ac = 0; iStack_8ac < local_28; iStack_8ac = iStack_8ac + 1) {
    for (sampleNdx_2 = 0; sampleNdx_2 < iStack_24; sampleNdx_2 = sampleNdx_2 + 1) {
      color.m_value._3_1_ = 0;
      for (local_8b8 = 0; iVar3 = local_8b8,
          sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height),
          iVar3 < (int)sVar7; local_8b8 = local_8b8 + 1) {
        pvVar5 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                           (_height,(long)local_8b8);
        local_8bc = tcu::Surface::getPixel(pvVar5,sampleNdx_2,iStack_8ac);
        iVar3 = tcu::RGBA::getGreen(&local_8bc);
        iVar4 = tcu::RGBA::getBlue(&local_8bc);
        tcu::Vector<float,_2>::Vector
                  ((Vector<float,_2> *)&sampleNdxB,(float)iVar3 / 255.0,(float)iVar4 / 255.0);
        pvVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                 operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                             *)&printCount,(long)local_8b8);
        *&pvVar9->m_data = _sampleNdxB;
      }
      local_8c8 = 0;
      while( true ) {
        iVar3 = local_8c8;
        sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
        local_19b9 = false;
        if (iVar3 < (int)sVar7) {
          local_19b9 = (color.m_value._3_1_ & 1) == 0 || local_6e8 < 5;
        }
        iVar3 = local_8c8;
        if (!local_19b9) break;
        while( true ) {
          local_8cc = iVar3 + 1;
          iVar3 = local_8cc;
          sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height);
          local_19c1 = false;
          if (iVar3 < (int)sVar7) {
            local_19c1 = (color.m_value._3_1_ & 1) == 0 || local_6e8 < 5;
          }
          if (!local_19c1) break;
          pvVar9 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
                   operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                               *)&printCount,(long)local_8c8);
          v = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         &printCount,(long)local_8cc);
          bVar2 = tcu::Vector<float,_2>::operator==(pvVar9,v);
          iVar3 = local_8cc;
          if (bVar2) {
            local_6e8 = local_6e8 + 1;
            if (local_6e8 < 6) {
              pTVar6 = tcu::TestContext::getLog
                                 ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                                  super_TestCase.super_TestCase.super_TestNode.m_testCtx);
              tcu::TestLog::operator<<
                        (&local_a50,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
              pMVar8 = tcu::MessageBuilder::operator<<(&local_a50,(char (*) [8])"Pixel (");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&sampleNdx_2);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&stack0xfffffffffffff754);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [12])"): Samples ");
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_8c8);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [6])0x2b82e30);
              pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_8cc);
              pMVar8 = tcu::MessageBuilder::operator<<
                                 (pMVar8,(char (*) [25])" have the same position.");
              tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder(&local_a50);
            }
            iVar4 = iStack_8ac;
            iVar3 = sampleNdx_2;
            color.m_value._3_1_ = 1;
            bVar1 = false;
            local_a54 = (deUint32)tcu::RGBA::red();
            tcu::Surface::setPixel
                      ((Surface *)
                       &samplePositions.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,iVar3,iVar4,
                       (RGBA)local_a54);
            iVar3 = local_8cc;
          }
        }
        local_8c8 = local_8c8 + 1;
      }
    }
  }
  if (!bVar1) {
    if (5 < local_6e8) {
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                          super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_bd8,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<(&local_bd8,(char (*) [5])0x2b66789);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])"Omitted ");
      local_bdc = local_6e8 + -5;
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_bdc);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2c3fe31);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_bd8);
    }
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_d60,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_d60,(char (*) [27])"Image verification failed.")
    ;
    pTVar6 = tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc0,"Verification",&local_dc1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_de8,"Image Verification",&local_de9);
    tcu::LogImageSet::LogImageSet(&local_da0,&local_dc0,&local_de8);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_da0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ea0,"ErrorMask",&local_ea1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ec8,"Error Mask",&local_ec9)
    ;
    tcu::Surface::getAccess
              ((PixelBufferAccess *)&verifier.m_distanceThreshold,
               (Surface *)
               &samplePositions.
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    tcu::LogImage::LogImage
              (&local_e80,&local_ea0,&local_ec8,
               (ConstPixelBufferAccess *)&verifier.m_distanceThreshold,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_e80);
    tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
    tcu::LogImage::~LogImage(&local_e80);
    std::__cxx11::string::~string((string *)&local_ec8);
    std::allocator<char>::~allocator(&local_ec9);
    std::__cxx11::string::~string((string *)&local_ea0);
    std::allocator<char>::~allocator(&local_ea1);
    tcu::LogImageSet::~LogImageSet(&local_da0);
    std::__cxx11::string::~string((string *)&local_de8);
    std::allocator<char>::~allocator(&local_de9);
    std::__cxx11::string::~string((string *)&local_dc0);
    std::allocator<char>::~allocator(&local_dc1);
    tcu::MessageBuilder::~MessageBuilder(&local_d60);
    local_29 = 0;
  }
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&printCount);
  tcu::Surface::~Surface
            ((Surface *)
             &samplePositions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  SampleAverageVerifier::SampleAverageVerifier
            ((SampleAverageVerifier *)&errorMask_1.m_pixels.m_cap,
             (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples);
  tcu::Surface::Surface((Surface *)&printFloodLimit_1,iStack_24,local_28);
  local_f2c = 0;
  local_f30 = 5;
  tcu::Surface::getAccess(&local_f58,(Surface *)&printFloodLimit_1);
  tcu::Vector<float,_4>::Vector(&local_f68,0.0,1.0,0.0,1.0);
  tcu::clear(&local_f58,&local_f68);
  if ((verifier.super_Verifier._vptr_Verifier._4_1_ & 1) != 0) {
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&x_1,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&x_1,
                        (char (*) [61])
                        "Verifying sample position distribution is (nearly) unbiased.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&x_1);
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    SampleAverageVerifier::logInfo((SampleAverageVerifier *)&errorMask_1.m_pixels.m_cap,pTVar6);
    for (colorSum.m_data[2] = 0; colorSum.m_data[2] < local_28;
        colorSum.m_data[2] = colorSum.m_data[2] + 1) {
      for (colorSum.m_data[1] = 0; colorSum.m_data[1] < iStack_24;
          colorSum.m_data[1] = colorSum.m_data[1] + 1) {
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&color_1,0,0,0);
        for (local_1100 = 0; iVar3 = local_1100,
            sVar7 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::size(_height),
            iVar3 < (int)sVar7; local_1100 = local_1100 + 1) {
          pvVar5 = std::vector<tcu::Surface,_std::allocator<tcu::Surface>_>::operator[]
                             (_height,(long)local_1100);
          local_1104 = tcu::Surface::getPixel(pvVar5,colorSum.m_data[1],colorSum.m_data[2]);
          iVar3 = tcu::RGBA::getRed(&local_1104);
          piVar10 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&color_1);
          *piVar10 = *piVar10 + iVar3;
          iVar3 = tcu::RGBA::getBlue(&local_1104);
          piVar10 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&color_1);
          *piVar10 = *piVar10 + iVar3;
          iVar3 = tcu::RGBA::getGreen(&local_1104);
          piVar10 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&color_1);
          *piVar10 = iVar3 + *piVar10;
        }
        iVar3 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples;
        piVar10 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&color_1);
        *piVar10 = *piVar10 / iVar3;
        iVar3 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples;
        piVar10 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&color_1);
        *piVar10 = *piVar10 / iVar3;
        iVar3 = (this->super_MultisampleRenderCase).super_MultisampleRenderCase.m_numTargetSamples;
        piVar10 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&color_1);
        *piVar10 = *piVar10 / iVar3;
        piVar10 = tcu::Vector<int,_3>::x((Vector<int,_3> *)&color_1);
        iVar3 = *piVar10;
        piVar10 = tcu::Vector<int,_3>::y((Vector<int,_3> *)&color_1);
        iVar4 = *piVar10;
        puVar11 = (uint *)tcu::Vector<int,_3>::z((Vector<int,_3> *)&color_1);
        siglen = (size_t)*puVar11;
        tbs = (uchar *)0x0;
        tcu::RGBA::RGBA(&local_1108,iVar3,iVar4,*puVar11,0);
        tcu::Vector<int,_2>::Vector(&local_1110,colorSum.m_data[1],colorSum.m_data[2]);
        iVar3 = SampleAverageVerifier::verify
                          ((SampleAverageVerifier *)&errorMask_1.m_pixels.m_cap,
                           (EVP_PKEY_CTX *)&local_1108,(uchar *)&local_1110,siglen,tbs,in_R9);
        if ((((byte)iVar3 ^ 0xff) & 1) != 0) {
          local_f2c = local_f2c + 1;
          if (local_f2c < 6) {
            pTVar6 = tcu::TestContext::getLog
                               ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                                super_TestCase.super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_1290,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message)
            ;
            pMVar8 = tcu::MessageBuilder::operator<<(&local_1290,(char (*) [8])"Pixel (");
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,colorSum.m_data + 1);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
            pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,colorSum.m_data + 2);
            pMVar8 = tcu::MessageBuilder::operator<<
                               (pMVar8,(char (*) [34])"): Sample distribution is biased.");
            tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_1290);
          }
          iVar4 = colorSum.m_data[2];
          iVar3 = colorSum.m_data[1];
          local_2a = 1;
          local_1294 = (deUint32)tcu::RGBA::red();
          tcu::Surface::setPixel((Surface *)&printFloodLimit_1,iVar3,iVar4,(RGBA)local_1294);
        }
      }
    }
    if ((local_2a & 1) != 0) {
      if (5 < local_f2c) {
        pTVar6 = tcu::TestContext::getLog
                           ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                            super_TestCase.super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1418,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar8 = tcu::MessageBuilder::operator<<(&local_1418,(char (*) [5])0x2b66789);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])"Omitted ");
        local_141c = local_f2c + -5;
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_141c);
        pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [21])0x2c3fe31);
        tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1418);
      }
      pTVar6 = tcu::TestContext::getLog
                         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                          super_TestCase.super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_15a0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_15a0,(char (*) [27])"Image verification failed.");
      pTVar6 = tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1600,"Verification",&local_1601);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1628,"Image Verification",&local_1629);
      tcu::LogImageSet::LogImageSet(&local_15e0,&local_1600,&local_1628);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_15e0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_16e0,"ErrorMask",&local_16e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1708,"Error Mask",&local_1709);
      tcu::Surface::getAccess((PixelBufferAccess *)&local_1738,(Surface *)&printFloodLimit_1);
      tcu::LogImage::LogImage
                (&local_16c0,&local_16e0,&local_1708,&local_1738,QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar6 = tcu::TestLog::operator<<(pTVar6,&local_16c0);
      tcu::TestLog::operator<<(pTVar6,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
      tcu::LogImage::~LogImage(&local_16c0);
      std::__cxx11::string::~string((string *)&local_1708);
      std::allocator<char>::~allocator(&local_1709);
      std::__cxx11::string::~string((string *)&local_16e0);
      std::allocator<char>::~allocator(&local_16e1);
      tcu::LogImageSet::~LogImageSet(&local_15e0);
      std::__cxx11::string::~string((string *)&local_1628);
      std::allocator<char>::~allocator(&local_1629);
      std::__cxx11::string::~string((string *)&local_1600);
      std::allocator<char>::~allocator(&local_1601);
      tcu::MessageBuilder::~MessageBuilder(&local_15a0);
    }
  }
  tcu::Surface::~Surface((Surface *)&printFloodLimit_1);
  if ((local_29 & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if ((local_2a & 1) != 0) {
      local_175a = 1;
      this_00 = (QualityWarning *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1758,
                 "Bias detected, sample positions are not uniformly distributed within the pixel",
                 &local_1759);
      MultisampleShaderRenderUtil::QualityWarning::QualityWarning(this_00,&local_1758);
      local_175a = 0;
      __cxa_throw(this_00,&MultisampleShaderRenderUtil::QualityWarning::typeinfo,
                  MultisampleShaderRenderUtil::QualityWarning::~QualityWarning);
    }
    pTVar6 = tcu::TestContext::getLog
                       ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.
                        super_TestCase.super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_18e0,pTVar6,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar8 = tcu::MessageBuilder::operator<<(&local_18e0,(char (*) [17])"Verification ok.");
    tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_18e0);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool SamplePosDistributionCase::verifySampleBuffers (const std::vector<tcu::Surface>& resultBuffers)
{
	const int	width				= resultBuffers[0].getWidth();
	const int	height				= resultBuffers[0].getHeight();
	bool		allOk				= true;
	bool		distibutionError	= false;

	// Check sample range, uniqueness, and distribution, log layers
	{
		m_testCtx.getLog() << tcu::TestLog::ImageSet("SampleBuffers", "Image sample buffers");
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			m_testCtx.getLog() << tcu::TestLog::Image("Buffer" + de::toString(sampleNdx), "Sample " + de::toString(sampleNdx), resultBuffers[sampleNdx].getAccess());
		m_testCtx.getLog() << tcu::TestLog::EndImageSet;
	}

	// verify range
	{
		bool rangeOk = true;

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position range" << tcu::TestLog::EndMessage;
		for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
		{
			// shader does the check, just check the shader error output (red)
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample " << (sampleNdx+1) << "/" << (int)resultBuffers.size() << tcu::TestLog::EndMessage;
			rangeOk &= verifyImageWithVerifier(resultBuffers[sampleNdx], m_testCtx.getLog(), NoRedVerifier(), false);
		}

		if (!rangeOk)
		{
			allOk = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "Sample position verification failed." << tcu::TestLog::EndMessage;
		}
	}

	// Verify uniqueness
	{
		bool					uniquenessOk	= true;
		tcu::Surface			errorMask		(width, height);
		std::vector<tcu::Vec2>	samplePositions	(resultBuffers.size());
		int						printCount		= 0;
		const int				printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position uniqueness." << tcu::TestLog::EndMessage;

		for (int y = 0; y < height; ++y)
		for (int x = 0; x < width; ++x)
		{
			bool samplePosNotUnique = false;

			for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
			{
				const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
				samplePositions[sampleNdx] = tcu::Vec2((float)color.getGreen() / 255.0f, (float)color.getBlue() / 255.0f);
			}

			// Just check there are no two samples with same positions
			for (int sampleNdxA = 0;            sampleNdxA < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxA)
			for (int sampleNdxB = sampleNdxA+1; sampleNdxB < (int)resultBuffers.size() && (!samplePosNotUnique || printCount < printFloodLimit); ++sampleNdxB)
			{
				if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Samples " << sampleNdxA << " and " << sampleNdxB << " have the same position."
							<< tcu::TestLog::EndMessage;
					}

					samplePosNotUnique = true;
					uniquenessOk = false;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}
		}

		// end result
		if (!uniquenessOk)
		{
			if (printCount > printFloodLimit)
				m_testCtx.getLog()
					<< tcu::TestLog::Message
					<< "...\n"
					<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
					<< tcu::TestLog::EndMessage;

			m_testCtx.getLog()
				<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
				<< tcu::TestLog::ImageSet("Verification", "Image Verification")
				<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
				<< tcu::TestLog::EndImageSet;

			allOk = false;
		}
	}

	// check distribution
	{
		const SampleAverageVerifier verifier		(m_numTargetSamples);
		tcu::Surface				errorMask		(width, height);
		int							printCount		= 0;
		const int					printFloodLimit	= 5;

		tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f));

		// don't bother with small sample counts
		if (verifier.m_isStatisticallySignificant)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying sample position distribution is (nearly) unbiased." << tcu::TestLog::EndMessage;
			verifier.logInfo(m_testCtx.getLog());

			for (int y = 0; y < height; ++y)
			for (int x = 0; x < width; ++x)
			{
				tcu::IVec3 colorSum(0, 0, 0);

				// color average

				for (int sampleNdx = 0; sampleNdx < (int)resultBuffers.size(); ++sampleNdx)
				{
					const tcu::RGBA color = resultBuffers[sampleNdx].getPixel(x, y);
					colorSum.x() += color.getRed();
					colorSum.y() += color.getBlue();
					colorSum.z() += color.getGreen();
				}

				colorSum.x() /= m_numTargetSamples;
				colorSum.y() /= m_numTargetSamples;
				colorSum.z() /= m_numTargetSamples;

				// verify average sample position

				if (!verifier.verify(tcu::RGBA(colorSum.x(), colorSum.y(), colorSum.z(), 0), tcu::IVec2(x, y)))
				{
					if (++printCount <= printFloodLimit)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message
							<< "Pixel (" << x << ", " << y << "): Sample distribution is biased."
							<< tcu::TestLog::EndMessage;
					}

					distibutionError = true;
					errorMask.setPixel(x, y, tcu::RGBA::red());
				}
			}

			// sub-verification result
			if (distibutionError)
			{
				if (printCount > printFloodLimit)
					m_testCtx.getLog()
						<< tcu::TestLog::Message
						<< "...\n"
						<< "Omitted " << (printCount-printFloodLimit) << " error descriptions."
						<< tcu::TestLog::EndMessage;

				m_testCtx.getLog()
					<< tcu::TestLog::Message << "Image verification failed." << tcu::TestLog::EndMessage
					<< tcu::TestLog::ImageSet("Verification", "Image Verification")
					<< tcu::TestLog::Image("ErrorMask", "Error Mask", errorMask.getAccess())
					<< tcu::TestLog::EndImageSet;
			}
		}
	}

	// results
	if (!allOk)
		return false;
	else if (distibutionError)
		throw MultisampleShaderRenderUtil::QualityWarning("Bias detected, sample positions are not uniformly distributed within the pixel");
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verification ok." << tcu::TestLog::EndMessage;
		return true;
	}
}